

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.h
# Opt level: O2

void __thiscall irr::scene::COBJMeshFileLoader::SObjMtl::SObjMtl(SObjMtl *this,SObjMtl *o)

{
  _Rb_tree_header *p_Var1;
  CMeshBuffer<irr::video::S3DVertex> *this_00;
  
  p_Var1 = &(this->VertMap)._M_t._M_impl.super__Rb_tree_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  core::string<char>::string(&this->Name,&o->Name);
  core::string<char>::string(&this->Group,&o->Group);
  this->Bumpiness = o->Bumpiness;
  this->Illumination = o->Illumination;
  this->RecalculateNormals = false;
  this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
  CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_00);
  this->Meshbuffer = this_00;
  video::SMaterial::operator=(&this_00->Material,&o->Meshbuffer->Material);
  return;
}

Assistant:

SObjMtl(const SObjMtl &o) :
				Name(o.Name), Group(o.Group),
				Bumpiness(o.Bumpiness), Illumination(o.Illumination),
				RecalculateNormals(false)
		{
			Meshbuffer = new SMeshBuffer();
			Meshbuffer->Material = o.Meshbuffer->Material;
		}